

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O0

void __thiscall
slang::syntax::SyntaxTree::SyntaxTree
          (SyntaxTree *this,SyntaxNode *root,SourceManager *sourceManager,BumpAllocator *alloc,
          SourceLibrary *library,shared_ptr<slang::syntax::SyntaxTree> *parent)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  reference ppDVar4;
  pointer pPVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined1 *in_RDI;
  undefined8 in_R8;
  __shared_ptr *in_R9;
  Token TVar6;
  SyntaxNode *in_stack_00000038;
  value_type macro;
  size_t i;
  BumpAllocator *in_stack_fffffffffffffe58;
  ParserMetadata *in_stack_fffffffffffffe60;
  ParserMetadata *in_stack_fffffffffffffe68;
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  BumpAllocator *in_stack_fffffffffffffe80;
  ulong local_128;
  BumpAllocator *in_stack_ffffffffffffffa8;
  Token *in_stack_ffffffffffffffb0;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = in_RSI;
  *(undefined8 *)(in_RDI + 0x10) = in_R8;
  *(undefined8 *)(in_RDI + 0x18) = in_RDX;
  BumpAllocator::BumpAllocator
            (in_stack_fffffffffffffe80,
             (BumpAllocator *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  Diagnostics::Diagnostics((Diagnostics *)0x31bc84);
  Bag::Bag((Bag *)0x31bc9a);
  std::
  unique_ptr<slang::parsing::ParserMetadata,std::default_delete<slang::parsing::ParserMetadata>>::
  unique_ptr<std::default_delete<slang::parsing::ParserMetadata>,void>
            ((unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
              *)in_stack_fffffffffffffe60);
  std::
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ::vector((vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
            *)0x31bcc8);
  parsing::ParserMetadata::fromSyntax(in_stack_00000038);
  std::make_unique<slang::parsing::ParserMetadata,slang::parsing::ParserMetadata>
            (in_stack_fffffffffffffe68);
  std::
  unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>::
  operator=((unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
             *)in_stack_fffffffffffffe60,
            (unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
             *)in_stack_fffffffffffffe58);
  std::
  unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>::
  ~unique_ptr((unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
               *)in_stack_fffffffffffffe60);
  parsing::ParserMetadata::~ParserMetadata(in_stack_fffffffffffffe60);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_R9);
  if (bVar1) {
    local_128 = 0;
    while( true ) {
      peVar2 = std::
               __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x31bd65);
      sVar3 = std::
              vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
              ::size(&peVar2->macros);
      if (sVar3 <= local_128) break;
      peVar2 = std::
               __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x31bd92);
      ppDVar4 = std::
                vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                ::operator[](&peVar2->macros,local_128);
      if (*ppDVar4 != (value_type)0x0) {
        deepClone<slang::syntax::DefineDirectiveSyntax>
                  ((DefineDirectiveSyntax *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      }
      std::
      vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
      ::push_back(in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68);
      local_128 = local_128 + 1;
    }
    std::
    unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
    ::operator->((unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
                  *)0x31be7b);
    bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x31be8a);
    if (!bVar1) {
      std::__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x31beab);
      getMetadata((SyntaxTree *)0x31beb3);
      TVar6 = parsing::Token::deepClone(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      pPVar5 = std::
               unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
               ::operator->((unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
                             *)0x31bf05);
      pPVar5->eofToken = TVar6;
    }
  }
  return;
}

Assistant:

SyntaxTree::SyntaxTree(SyntaxNode* root, SourceManager& sourceManager, BumpAllocator&& alloc,
                       const SourceLibrary* library, const std::shared_ptr<SyntaxTree>& parent) :
    rootNode(root), library(library), sourceMan(sourceManager), alloc(std::move(alloc)) {
    metadata = std::make_unique<ParserMetadata>(ParserMetadata::fromSyntax(*root));
    if (parent) { // copy parent's info
        for (size_t i = 0; i < parent->macros.size(); ++i) {
            auto macro = parent->macros[i];
            if (macro)
                macro = deepClone(*macro, this->alloc);
            macros.push_back(macro);
        }
        if (!metadata->eofToken)
            metadata->eofToken = parent->getMetadata().eofToken.deepClone(this->alloc);
    }
}